

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LexicalCast.h
# Opt level: O2

enable_if_t<std::is_arithmetic<unsigned_long>::value,_bool> __thiscall
beast::detail::LexicalCast<std::__cxx11::string,unsigned_long>::operator()
          (void *this,string *out,unsigned_long in)

{
  string local_30;
  
  std::__cxx11::to_string(&local_30,in);
  std::__cxx11::string::operator=((string *)out,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return true;
}

Assistant:

std::enable_if_t <std::is_arithmetic <Arithmetic>::value, bool>
    operator () (std::string& out, Arithmetic in)
    {
        out = std::to_string (in);
        return true;
    }